

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thdat06.c
# Opt level: O0

int th06_open(thdat_t *thdat,thtk_error_t **error)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ssize_t sVar4;
  off_t oVar5;
  thdat_entry_t *ptVar6;
  thtk_io_t *output;
  size_t sVar7;
  uint32_t *puVar8;
  ulong uVar9;
  thdat_entry_t *entry_2;
  thdat_entry_t *ptStack_98;
  uint i_2;
  thdat_entry_t *prev;
  off_t end_offset;
  thdat_entry_t *entry_1;
  uchar *puStack_78;
  uint i_1;
  uint32_t *ptr;
  thtk_io_t *entry_headers;
  off_t end;
  uint local_58;
  th07_header_t header;
  thdat_entry_t *entry;
  uint i;
  uint32_t entry_count;
  bitstream b;
  char magic [4];
  thtk_error_t **error_local;
  thdat_t *thdat_local;
  
  sVar4 = thtk_io_read(thdat->stream,&b.field_0x14,4,error);
  if (sVar4 != 4) {
    return 0;
  }
  iVar1 = strncmp(&b.field_0x14,"PBG3",4);
  if (iVar1 == 0) {
    bitstream_init((bitstream *)&i,thdat->stream);
    uVar2 = th06_read_uint32((bitstream *)&i);
    uVar3 = th06_read_uint32((bitstream *)&i);
    thdat->offset = uVar3;
    oVar5 = thtk_io_seek(thdat->stream,(ulong)thdat->offset,0,error);
    if (oVar5 == -1) {
      return 0;
    }
    bitstream_init((bitstream *)&i,thdat->stream);
    for (entry._0_4_ = 0; (uint)entry < uVar2; entry._0_4_ = (uint)entry + 1) {
      thdat->entry_count = thdat->entry_count + 1;
      ptVar6 = (thdat_entry_t *)realloc(thdat->entries,thdat->entry_count * 0x120);
      thdat->entries = ptVar6;
      header._4_8_ = thdat->entries + (thdat->entry_count - 1);
      thdat_entry_init((thdat_entry_t *)header._4_8_);
      th06_read_uint32((bitstream *)&i);
      th06_read_uint32((bitstream *)&i);
      uVar3 = th06_read_uint32((bitstream *)&i);
      *(uint32_t *)(header._4_8_ + 0x104) = uVar3;
      uVar3 = th06_read_uint32((bitstream *)&i);
      *(ulong *)(header._4_8_ + 0x118) = (ulong)uVar3;
      uVar3 = th06_read_uint32((bitstream *)&i);
      *(ulong *)(header._4_8_ + 0x108) = (ulong)uVar3;
      th06_read_string((bitstream *)&i,0xff,(char *)header._4_8_);
    }
  }
  else {
    iVar1 = strncmp(&b.field_0x14,"PBG4",4);
    if (iVar1 != 0) {
      thtk_error_func_new(error,"th06_open","magic string not recognized");
      return 0;
    }
    sVar4 = thtk_io_read(thdat->stream,(void *)((long)&end + 4),0xc,error);
    if (sVar4 != 0xc) {
      return 0;
    }
    oVar5 = thtk_io_seek(thdat->stream,0,2,error);
    if (oVar5 == -1) {
      return 0;
    }
    oVar5 = thtk_io_seek(thdat->stream,(ulong)local_58,0,error);
    if (oVar5 == -1) {
      return 0;
    }
    output = thtk_io_open_growing_memory(error);
    sVar4 = th_unlzss(thdat->stream,output,(ulong)header.count,error);
    if (sVar4 == -1) {
      return 0;
    }
    puStack_78 = thtk_io_map(output,0,(ulong)header.count,error);
    if (puStack_78 == (uchar *)0x0) {
      return 0;
    }
    for (entry_1._4_4_ = 0; entry_1._4_4_ < end._4_4_; entry_1._4_4_ = entry_1._4_4_ + 1) {
      thdat->entry_count = thdat->entry_count + 1;
      ptVar6 = (thdat_entry_t *)realloc(thdat->entries,thdat->entry_count * 0x120);
      thdat->entries = ptVar6;
      ptVar6 = thdat->entries + (thdat->entry_count - 1);
      thdat_entry_init(ptVar6);
      strcpy(ptVar6->name,(char *)puStack_78);
      sVar7 = strlen(ptVar6->name);
      ptVar6->offset = (ulong)*(uint *)(puStack_78 + sVar7 + 1);
      puVar8 = (uint32_t *)(puStack_78 + sVar7 + 9);
      ptVar6->size = (ulong)*(uint *)(puStack_78 + sVar7 + 5);
      puStack_78 = puStack_78 + sVar7 + 0xd;
      ptVar6->extra = *puVar8;
    }
    thtk_io_unmap(output,puStack_78);
    thtk_io_close(output);
  }
  oVar5 = thtk_io_seek(thdat->stream,0,2,error);
  if (oVar5 == -1) {
    thdat_local._4_4_ = 0;
  }
  else {
    if (thdat->entry_count != 0) {
      ptStack_98 = (thdat_entry_t *)0x0;
      for (entry_2._4_4_ = 0; (ulong)entry_2._4_4_ < thdat->entry_count;
          entry_2._4_4_ = entry_2._4_4_ + 1) {
        ptVar6 = thdat->entries;
        uVar9 = (ulong)entry_2._4_4_;
        if (ptStack_98 != (thdat_entry_t *)0x0) {
          ptStack_98->zsize = ptVar6[uVar9].offset - ptStack_98->offset;
        }
        ptStack_98 = ptVar6 + uVar9;
      }
      ptStack_98->zsize = oVar5 - ptStack_98->offset;
    }
    thdat_local._4_4_ = 1;
  }
  return thdat_local._4_4_;
}

Assistant:

static int
th06_open(
    thdat_t* thdat,
    thtk_error_t** error)
{
    char magic[4];

    if (thtk_io_read(thdat->stream, magic, 4, error) != 4)
        return 0;

    if (strncmp(magic, "PBG3", 4) == 0) {
        struct bitstream b;
        bitstream_init(&b, thdat->stream);
        uint32_t entry_count = th06_read_uint32(&b);
        thdat->offset = th06_read_uint32(&b);

        if (thtk_io_seek(thdat->stream, thdat->offset, SEEK_SET, error) == -1)
            return 0;

        bitstream_init(&b, thdat->stream);
        for (unsigned int i = 0; i < entry_count; ++i) {
            thdat_entry_t* entry;
            ARRAY_GROW(thdat->entry_count, thdat->entries, entry);
            thdat_entry_init(entry);
            th06_read_uint32(&b);
            th06_read_uint32(&b);
            entry->extra = th06_read_uint32(&b);
            entry->offset = th06_read_uint32(&b);
            entry->size = th06_read_uint32(&b);
            th06_read_string(&b, 255, entry->name);
        }
    } else if (strncmp(magic, "PBG4", 4) == 0) {
        th07_header_t header;

        if (thtk_io_read(thdat->stream, &header, sizeof(header), error) != sizeof(header))
            return 0;

        off_t end = thtk_io_seek(thdat->stream, 0, SEEK_END, error);
        if (end == -1)
            return 0;

        if (thtk_io_seek(thdat->stream, header.offset, SEEK_SET, error) == -1)
            return 0;

        thtk_io_t* entry_headers = thtk_io_open_growing_memory(error);
        /* XXX: I can't use header.size for this. */
        if (th_unlzss(thdat->stream, entry_headers, header.size, error) == -1)
            return 0;

        const uint32_t* ptr = (uint32_t*)thtk_io_map(entry_headers, 0, header.size, error);
        if (!ptr)
            return 0;
        for (unsigned int i = 0; i < header.count; ++i) {
            thdat_entry_t* entry = NULL;
            ARRAY_GROW(thdat->entry_count, thdat->entries, entry);
            thdat_entry_init(entry);
            strcpy(entry->name, (char*)ptr);
            ptr = (uint32_t*)((char*)ptr + strlen(entry->name) + 1);
            entry->offset = *ptr++;
            entry->size = *ptr++;
            entry->extra = *ptr++;
        }

        thtk_io_unmap(entry_headers, (unsigned char*)ptr);
        thtk_io_close(entry_headers);
    } else {
        thtk_error_new(error, "magic string not recognized");
        return 0;
    }

    off_t end_offset = thtk_io_seek(thdat->stream, 0, SEEK_END, error);
    if (end_offset == -1)
        return 0;

    if (thdat->entry_count) {
        thdat_entry_t* prev = NULL;
        for (unsigned int i = 0; i < thdat->entry_count; ++i) {
            thdat_entry_t* entry = &thdat->entries[i];
            if (prev)
                prev->zsize = entry->offset - prev->offset;
            prev = entry;
        }
        prev->zsize = end_offset - prev->offset;
    }

    return 1;
}